

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O0

bool __thiscall CNetMsg_Cl_StartInfo::Pack(CNetMsg_Cl_StartInfo *this,CMsgPacker *pPacker)

{
  bool bVar1;
  CPacker *in_RSI;
  undefined8 *in_RDI;
  int i;
  
  CPacker::AddString(in_RSI,(char *)*in_RDI,-1);
  CPacker::AddString(in_RSI,(char *)in_RDI[1],-1);
  i = (int)((ulong)in_RDI >> 0x20);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddString(in_RSI,(char *)in_RDI[3],-1);
  CPacker::AddString(in_RSI,(char *)in_RDI[4],-1);
  CPacker::AddString(in_RSI,(char *)in_RDI[5],-1);
  CPacker::AddString(in_RSI,(char *)in_RDI[6],-1);
  CPacker::AddString(in_RSI,(char *)in_RDI[7],-1);
  CPacker::AddString(in_RSI,(char *)in_RDI[8],-1);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  bVar1 = CPacker::Error(in_RSI);
  return bVar1;
}

Assistant:

bool Pack(CMsgPacker *pPacker)
	{
		pPacker->AddString(m_pName, -1);
		pPacker->AddString(m_pClan, -1);
		pPacker->AddInt(m_Country);
		pPacker->AddString(m_apSkinPartNames[0], -1);
		pPacker->AddString(m_apSkinPartNames[1], -1);
		pPacker->AddString(m_apSkinPartNames[2], -1);
		pPacker->AddString(m_apSkinPartNames[3], -1);
		pPacker->AddString(m_apSkinPartNames[4], -1);
		pPacker->AddString(m_apSkinPartNames[5], -1);
		pPacker->AddInt(m_aUseCustomColors[0]);
		pPacker->AddInt(m_aUseCustomColors[1]);
		pPacker->AddInt(m_aUseCustomColors[2]);
		pPacker->AddInt(m_aUseCustomColors[3]);
		pPacker->AddInt(m_aUseCustomColors[4]);
		pPacker->AddInt(m_aUseCustomColors[5]);
		pPacker->AddInt(m_aSkinPartColors[0]);
		pPacker->AddInt(m_aSkinPartColors[1]);
		pPacker->AddInt(m_aSkinPartColors[2]);
		pPacker->AddInt(m_aSkinPartColors[3]);
		pPacker->AddInt(m_aSkinPartColors[4]);
		pPacker->AddInt(m_aSkinPartColors[5]);
		return pPacker->Error() != 0;
	}